

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::GenerateProfiledNewScArrayFastPath
          (Lowerer *this,Instr *instr,ArrayCallSiteInfo *arrayInfo,intptr_t arrayInfoAddr,
          intptr_t weakFuncRef,uint32 length)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  uint32 uVar4;
  uint32 uVar5;
  BOOL BVar6;
  Opnd *pOVar7;
  RegOpnd *pRVar8;
  undefined4 *puVar9;
  RegOpnd *pRVar10;
  AddrOpnd *pAVar11;
  LabelInstr *target;
  bool local_111;
  bool local_e9;
  LabelInstr *doneLabel;
  AutoReuseOpnd autoReuseHeadOpnd_2;
  uint offsetStart_1;
  uint offsetStart;
  AutoReuseOpnd autoReuseHeadOpnd_1;
  undefined1 local_88 [8];
  AutoReuseOpnd autoReuseHeadOpnd;
  uint32 i;
  RegOpnd *headOpnd;
  RegOpnd *dstOpnd;
  bool isZeroed;
  LabelInstr *pLStack_50;
  uint32 size;
  LabelInstr *helperLabel;
  Func *func;
  intptr_t iStack_38;
  uint32 length_local;
  intptr_t weakFuncRef_local;
  intptr_t arrayInfoAddr_local;
  ArrayCallSiteInfo *arrayInfo_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  func._4_4_ = length;
  iStack_38 = weakFuncRef;
  weakFuncRef_local = arrayInfoAddr;
  arrayInfoAddr_local = (intptr_t)arrayInfo;
  arrayInfo_local = (ArrayCallSiteInfo *)instr;
  instr_local = (Instr *)this;
  sourceContextId = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar3 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eafdf0,ArrayCtorFastPathPhase,sourceContextId,functionId);
  if ((bVar3) || ((DAT_01ea9ef9 & 1) != 0)) {
    this_local._7_1_ = false;
  }
  else {
    helperLabel = (LabelInstr *)this->m_func;
    pLStack_50 = IR::LabelInstr::New(Label,(Func *)helperLabel,true);
    dstOpnd._4_4_ = func._4_4_;
    pOVar7 = IR::Instr::GetDst((Instr *)arrayInfo_local);
    pRVar8 = IR::Opnd::AsRegOpnd(pOVar7);
    autoReuseHeadOpnd._20_4_ = func._4_4_;
    pOVar7 = IR::Instr::GetDst((Instr *)arrayInfo_local);
    local_e9 = false;
    if (pOVar7 != (Opnd *)0x0) {
      pOVar7 = IR::Instr::GetDst((Instr *)arrayInfo_local);
      autoReuseHeadOpnd._18_2_ = IR::Opnd::GetValueType(pOVar7);
      local_e9 = ValueType::IsLikelyNativeIntArray((ValueType *)&autoReuseHeadOpnd.field_0x12);
    }
    if (local_e9 == false) {
      pOVar7 = IR::Instr::GetDst((Instr *)arrayInfo_local);
      local_111 = false;
      if (pOVar7 != (Opnd *)0x0) {
        pOVar7 = IR::Instr::GetDst((Instr *)arrayInfo_local);
        autoReuseHeadOpnd_1._18_2_ = IR::Opnd::GetValueType(pOVar7);
        local_111 = ValueType::IsLikelyNativeFloatArray
                              ((ValueType *)&autoReuseHeadOpnd_1.field_0x12);
      }
      if (local_111 == false) {
        BVar6 = IsSmallObject<Js::JavascriptArray>(this,func._4_4_);
        if (BVar6 == 0) {
          return false;
        }
        autoReuseHeadOpnd_2.autoDelete = true;
        autoReuseHeadOpnd_2.wasInUse = false;
        autoReuseHeadOpnd_2._18_2_ = 0;
        pRVar8 = GenerateArrayLiteralsAlloc<Js::JavascriptArray>
                           (this,(Instr *)arrayInfo_local,(uint32 *)((long)&dstOpnd + 4),
                            (ArrayCallSiteInfo *)arrayInfoAddr_local,(bool *)((long)&dstOpnd + 3));
        IR::AutoReuseOpnd::AutoReuseOpnd
                  ((AutoReuseOpnd *)&doneLabel,&pRVar8->super_Opnd,(Func *)helperLabel,true);
        for (; (uint)autoReuseHeadOpnd._20_4_ < dstOpnd._4_4_;
            autoReuseHeadOpnd._20_4_ = autoReuseHeadOpnd._20_4_ + 1) {
          iVar1 = autoReuseHeadOpnd._20_4_ * 8;
          pOVar7 = GetMissingItemOpndForAssignment(TyVar,this->m_func);
          GenerateMemInit(this,pRVar8,iVar1 + 0x18,pOVar7,(Instr *)arrayInfo_local,
                          (bool)(dstOpnd._3_1_ & 1));
        }
        IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&doneLabel);
      }
      else {
        BVar6 = IsSmallObject<Js::JavascriptNativeFloatArray>(this,func._4_4_);
        if (BVar6 == 0) {
          return false;
        }
        GenerateArrayInfoIsNativeFloatAndNotIntArrayTest
                  (this,(Instr *)arrayInfo_local,(ArrayCallSiteInfo *)arrayInfoAddr_local,
                   weakFuncRef_local,pLStack_50);
        uVar4 = Js::JavascriptArray::GetOffsetOfArrayFlags();
        uVar5 = Js::JavascriptNativeArray::GetOffsetOfArrayCallSiteIndex();
        if ((ulong)uVar4 + 2 != (ulong)uVar5) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0xe81,
                             "(Js::JavascriptNativeFloatArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeFloatArray::GetOffsetOfArrayCallSiteIndex())"
                             ,
                             "Js::JavascriptNativeFloatArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeFloatArray::GetOffsetOfArrayCallSiteIndex()"
                            );
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        pRVar10 = GenerateArrayLiteralsAlloc<Js::JavascriptNativeFloatArray>
                            (this,(Instr *)arrayInfo_local,(uint32 *)((long)&dstOpnd + 4),
                             (ArrayCallSiteInfo *)arrayInfoAddr_local,(bool *)((long)&dstOpnd + 3));
        IR::AutoReuseOpnd::AutoReuseOpnd
                  ((AutoReuseOpnd *)&offsetStart_1,&pRVar10->super_Opnd,(Func *)helperLabel,true);
        uVar4 = Js::JavascriptNativeArray::GetOffsetOfWeakFuncRef();
        pAVar11 = IR::AddrOpnd::New(iStack_38,AddrOpndKindDynamicFunctionBodyWeakRef,this->m_func,
                                    false,(Var)0x0);
        GenerateMemInit(this,pRVar8,uVar4,&pAVar11->super_Opnd,(Instr *)arrayInfo_local,
                        (bool)(dstOpnd._3_1_ & 1));
        autoReuseHeadOpnd_2._20_4_ = 0x18;
        for (; (uint)autoReuseHeadOpnd._20_4_ < dstOpnd._4_4_;
            autoReuseHeadOpnd._20_4_ = autoReuseHeadOpnd._20_4_ + 1) {
          iVar1 = autoReuseHeadOpnd._20_4_ * 8;
          pOVar7 = GetMissingItemOpndForAssignment(TyFloat64,this->m_func);
          GenerateMemInit(this,pRVar10,iVar1 + 0x18,pOVar7,(Instr *)arrayInfo_local,
                          (bool)(dstOpnd._3_1_ & 1));
        }
        IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&offsetStart_1);
      }
    }
    else {
      BVar6 = IsSmallObject<Js::JavascriptNativeIntArray>(this,func._4_4_);
      if (BVar6 == 0) {
        return false;
      }
      GenerateArrayInfoIsNativeIntArrayTest
                (this,(Instr *)arrayInfo_local,(ArrayCallSiteInfo *)arrayInfoAddr_local,
                 weakFuncRef_local,pLStack_50);
      uVar4 = Js::JavascriptArray::GetOffsetOfArrayFlags();
      uVar5 = Js::JavascriptNativeArray::GetOffsetOfArrayCallSiteIndex();
      if ((ulong)uVar4 + 2 != (ulong)uVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0xe6f,
                           "(Js::JavascriptNativeIntArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeIntArray::GetOffsetOfArrayCallSiteIndex())"
                           ,
                           "Js::JavascriptNativeIntArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeIntArray::GetOffsetOfArrayCallSiteIndex()"
                          );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      pRVar10 = GenerateArrayLiteralsAlloc<Js::JavascriptNativeIntArray>
                          (this,(Instr *)arrayInfo_local,(uint32 *)((long)&dstOpnd + 4),
                           (ArrayCallSiteInfo *)arrayInfoAddr_local,(bool *)((long)&dstOpnd + 3));
      IR::AutoReuseOpnd::AutoReuseOpnd
                ((AutoReuseOpnd *)local_88,&pRVar10->super_Opnd,(Func *)helperLabel,true);
      uVar4 = Js::JavascriptNativeArray::GetOffsetOfWeakFuncRef();
      pAVar11 = IR::AddrOpnd::New(iStack_38,AddrOpndKindDynamicFunctionBodyWeakRef,this->m_func,
                                  false,(Var)0x0);
      GenerateMemInit(this,pRVar8,uVar4,&pAVar11->super_Opnd,(Instr *)arrayInfo_local,
                      (bool)(dstOpnd._3_1_ & 1));
      for (; (uint)autoReuseHeadOpnd._20_4_ < dstOpnd._4_4_;
          autoReuseHeadOpnd._20_4_ = autoReuseHeadOpnd._20_4_ + 1) {
        GenerateMemInit(this,pRVar10,autoReuseHeadOpnd._20_4_ * 4 + 0x18,-0x7fffe,
                        (Instr *)arrayInfo_local,(bool)(dstOpnd._3_1_ & 1));
      }
      IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_88);
    }
    target = IR::LabelInstr::New(Label,(Func *)helperLabel,false);
    InsertBranch(Br,target,(Instr *)arrayInfo_local);
    IR::Instr::InsertBefore((Instr *)arrayInfo_local,&pLStack_50->super_Instr);
    IR::Instr::InsertAfter((Instr *)arrayInfo_local,&target->super_Instr);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
Lowerer::GenerateProfiledNewScArrayFastPath(IR::Instr *instr, Js::ArrayCallSiteInfo * arrayInfo, intptr_t arrayInfoAddr, intptr_t weakFuncRef, uint32 length)
{
    if (PHASE_OFF(Js::ArrayCtorFastPathPhase, m_func) || CONFIG_FLAG(ForceES5Array))
    {
        return false;
    }

    Func * func = this->m_func;
    IR::LabelInstr * helperLabel = IR::LabelInstr::New(Js::OpCode::Label, func, true);
    uint32 size = length;
    bool isZeroed;
    IR::RegOpnd *dstOpnd = instr->GetDst()->AsRegOpnd();
    IR::RegOpnd *headOpnd;
    uint32 i = length;

    if (instr->GetDst() && instr->GetDst()->GetValueType().IsLikelyNativeIntArray())
    {
        if (!IsSmallObject<Js::JavascriptNativeIntArray>(length))
        {
            return false;
        }
        GenerateArrayInfoIsNativeIntArrayTest(instr, arrayInfo, arrayInfoAddr, helperLabel);
        Assert(Js::JavascriptNativeIntArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeIntArray::GetOffsetOfArrayCallSiteIndex());
        headOpnd = GenerateArrayLiteralsAlloc<Js::JavascriptNativeIntArray>(instr, &size, arrayInfo, &isZeroed);
        const IR::AutoReuseOpnd autoReuseHeadOpnd(headOpnd, func);

        GenerateMemInit(dstOpnd, Js::JavascriptNativeIntArray::GetOffsetOfWeakFuncRef(), IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, m_func), instr, isZeroed);
        for (; i < size; i++)
        {
            GenerateMemInit(headOpnd, sizeof(Js::SparseArraySegmentBase) + i * sizeof(int32),
                Js::JavascriptNativeIntArray::MissingItem, instr, isZeroed);
        }
    }
    else if (instr->GetDst() && instr->GetDst()->GetValueType().IsLikelyNativeFloatArray())
    {
        if (!IsSmallObject<Js::JavascriptNativeFloatArray>(length))
        {
            return false;
        }
        GenerateArrayInfoIsNativeFloatAndNotIntArrayTest(instr, arrayInfo, arrayInfoAddr, helperLabel);
        Assert(Js::JavascriptNativeFloatArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeFloatArray::GetOffsetOfArrayCallSiteIndex());
        headOpnd = GenerateArrayLiteralsAlloc<Js::JavascriptNativeFloatArray>(instr, &size, arrayInfo, &isZeroed);
        const IR::AutoReuseOpnd autoReuseHeadOpnd(headOpnd, func);

        GenerateMemInit(dstOpnd, Js::JavascriptNativeFloatArray::GetOffsetOfWeakFuncRef(), IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, m_func), instr, isZeroed);
        // Js::JavascriptArray::MissingItem is a Var, so it may be 32-bit or 64 bit.
        uint const offsetStart = sizeof(Js::SparseArraySegmentBase);
        for (; i < size; i++)
        {
            GenerateMemInit(
                headOpnd, offsetStart + i * sizeof(double),
                GetMissingItemOpndForAssignment(TyFloat64, m_func),
                instr, isZeroed);
        }
    }
    else
    {
        if (!IsSmallObject<Js::JavascriptArray>(length))
        {
            return false;
        }
        uint const offsetStart = sizeof(Js::SparseArraySegmentBase);
        headOpnd = GenerateArrayLiteralsAlloc<Js::JavascriptArray>(instr, &size, arrayInfo, &isZeroed);
        const IR::AutoReuseOpnd autoReuseHeadOpnd(headOpnd, func);
        for (; i < size; i++)
        {
            GenerateMemInit(
                headOpnd, offsetStart + i * sizeof(Js::Var),
                GetMissingItemOpndForAssignment(TyVar, m_func),
                instr, isZeroed);
        }
    }

    // Skip pass the helper call
    IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
    InsertBranch(Js::OpCode::Br, doneLabel, instr);
    instr->InsertBefore(helperLabel);

    instr->InsertAfter(doneLabel);
    return true;
}